

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::SwitchPrivate::setState(SwitchPrivate *this,State st)

{
  QStyleOption local_58 [8];
  QStyleOption opt;
  QRect local_48 [3];
  State local_14;
  SwitchPrivate *pSStack_10;
  State st_local;
  SwitchPrivate *this_local;
  
  if (this->state != st) {
    this->state = st;
    local_14 = st;
    pSStack_10 = this;
    QStyleOption::QStyleOption(local_58,1,0);
    QStyleOption::initFrom((QWidget *)local_58);
    initOffset(this,local_48);
    emitSignals(this);
    QWidget::update();
    QStyleOption::~QStyleOption(local_58);
  }
  return;
}

Assistant:

void
SwitchPrivate::setState( Switch::State st )
{
	if( state != st )
	{
		state = st;

		QStyleOption opt;
		opt.initFrom( q );

		initOffset( opt.rect );

		emitSignals();

		q->update();
	}
}